

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

int __thiscall deqp::egl::Image::ModifyTests::init(ModifyTests *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
  *this_00;
  int iVar1;
  bool bVar2;
  ImageFormatCase *this_01;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TestSpec spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  LabeledActions *local_d0;
  long local_c8;
  TestSpec local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"tex_",(allocator<char> *)&local_f8);
  ImageTests::addCreateTexture2DActions(&this->super_ImageTests,&local_c0.name);
  std::__cxx11::string::~string((string *)&local_c0);
  ImageTests::addCreateRenderbufferActions(&this->super_ImageTests);
  ImageTests::addCreateAndroidNativeActions(&this->super_ImageTests);
  addModifyActions(this);
  local_d0 = &(this->super_ImageTests).m_createActions;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->m_modifyActions;
  for (local_c8 = 0; iVar1 = (this->super_ImageTests).m_createActions.m_numActions, local_c8 < iVar1
      ; local_c8 = local_c8 + 1) {
    __lhs = &local_d0->m_actions[local_c8].label;
    __rhs = local_d8;
    for (lVar3 = 0; lVar3 < (this->m_modifyActions).m_numActions; lVar3 = lVar3 + 1) {
      bVar2 = isCompatibleCreateAndModifyActions
                        ((Action *)__lhs[1]._M_dataplus._M_p,(Action *)__rhs[1]._M_dataplus._M_p);
      if (bVar2) {
        local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
        local_c0.name._M_string_length = 0;
        local_c0.name.field_2._M_local_buf[0] = '\0';
        local_c0.desc._M_dataplus._M_p = (pointer)&local_c0.desc.field_2;
        local_c0.desc._M_string_length = 0;
        local_c0.desc.field_2._M_local_buf[0] = '\0';
        local_c0.operations.
        super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c0.operations.
        super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c0.contexts.
        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c0.operations.
        super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c0.contexts.
        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c0.contexts.
        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::operator+(&local_50,__lhs,"_");
        std::operator+(&local_f8,&local_50,__rhs);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::assign((char *)&local_c0.desc);
        local_f8._M_dataplus._M_p._0_4_ = 0;
        std::
        vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
        ::emplace_back<deqp::egl::Image::TestSpec::ApiContext>
                  (&local_c0.contexts,(ApiContext *)&local_f8);
        local_f8._M_string_length = (size_type)__lhs[1]._M_dataplus._M_p;
        local_f8._M_dataplus._M_p._0_4_ = 0;
        this_00 = &local_c0.operations;
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::emplace_back<deqp::egl::Image::TestSpec::Operation>(this_00,(Operation *)&local_f8);
        local_f8._M_dataplus._M_p._0_4_ = 0;
        local_f8._M_string_length = (size_type)&this->m_renderAction;
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::emplace_back<deqp::egl::Image::TestSpec::Operation>(this_00,(Operation *)&local_f8);
        local_f8._M_string_length = (size_type)__rhs[1]._M_dataplus._M_p;
        local_f8._M_dataplus._M_p._0_4_ = 0;
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::emplace_back<deqp::egl::Image::TestSpec::Operation>(this_00,(Operation *)&local_f8);
        local_f8._M_dataplus._M_p._0_4_ = 0;
        local_f8._M_string_length = (size_type)&this->m_renderAction;
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::emplace_back<deqp::egl::Image::TestSpec::Operation>(this_00,(Operation *)&local_f8);
        this_01 = (ImageFormatCase *)operator_new(0x1bc8);
        ImageFormatCase::ImageFormatCase
                  (this_01,(this->super_ImageTests).super_TestCaseGroup.m_eglTestCtx,&local_c0);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
        TestSpec::~TestSpec(&local_c0);
      }
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__rhs[1].field_2
      ;
    }
  }
  return iVar1;
}

Assistant:

void ModifyTests::init (void)
{
	addCreateTexture2DActions("tex_");
	addCreateRenderbufferActions();
	addCreateAndroidNativeActions();
	addModifyActions();

	for (int createNdx = 0; createNdx < m_createActions.size(); createNdx++)
	{
		LabeledAction& createAction = m_createActions[createNdx];

		for (int modifyNdx = 0; modifyNdx < m_modifyActions.size(); modifyNdx++)
		{
			LabeledAction& modifyAction = m_modifyActions[modifyNdx];

			if (!isCompatibleCreateAndModifyActions(*createAction.action, *modifyAction.action))
				continue;

			TestSpec spec;
			spec.name = createAction.label + "_" + modifyAction.label;
			spec.desc = "gles2_tex_sub_image";

			spec.contexts.push_back(TestSpec::API_GLES2);

			spec.operations.push_back(TestSpec::Operation(0, *createAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));
			spec.operations.push_back(TestSpec::Operation(0, *modifyAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));

			addChild(new ImageFormatCase(m_eglTestCtx, spec));
		}
	}
}